

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

StringRef __thiscall
llvm::yaml::ScalarNode::getValue(ScalarNode *this,SmallVectorImpl<char> *Storage)

{
  StringRef *this_00;
  size_t sVar1;
  StringRef UnquotedValue_00;
  char cVar2;
  size_type i;
  void *pvVar3;
  char *pcVar4;
  iterator I;
  ulong uVar5;
  ulong __n;
  StringRef Chars;
  StringRef SVar6;
  long lStack_50;
  StringRef UnquotedValue;
  
  this_00 = &this->Value;
  cVar2 = StringRef::operator[](this_00,0);
  if (cVar2 == '\"') {
    sVar1 = (this->Value).Length;
    UnquotedValue.Length = sVar1 - (sVar1 != 0);
    pcVar4 = (this->Value).Data + (sVar1 != 0);
    if (sVar1 - 2 <= UnquotedValue.Length) {
      UnquotedValue.Length = sVar1 - 2;
    }
    UnquotedValue.Data._0_1_ = SUB81(pcVar4,0);
    UnquotedValue.Data._1_7_ = (undefined7)((ulong)pcVar4 >> 8);
    Chars.Length = 3;
    Chars.Data = "\\\r\n";
    i = StringRef::find_first_of(&UnquotedValue,Chars,0);
    SVar6.Data._1_7_ = UnquotedValue.Data._1_7_;
    SVar6.Data._0_1_ = UnquotedValue.Data._0_1_;
    SVar6.Length = UnquotedValue.Length;
    UnquotedValue_00.Data._1_7_ = UnquotedValue.Data._1_7_;
    UnquotedValue_00.Data._0_1_ = UnquotedValue.Data._0_1_;
    UnquotedValue_00.Length = UnquotedValue.Length;
    if (i != 0xffffffffffffffff) {
      SVar6 = unescapeDoubleQuoted(this,UnquotedValue_00,i,Storage);
    }
  }
  else {
    cVar2 = StringRef::operator[](this_00,0);
    if (cVar2 == '\'') {
      sVar1 = (this->Value).Length;
      __n = sVar1 - (sVar1 != 0);
      pcVar4 = (this->Value).Data + (sVar1 != 0);
      if (sVar1 - 2 <= __n) {
        __n = sVar1 - 2;
      }
      SVar6.Length = __n;
      SVar6.Data = pcVar4;
      if (__n == 0) {
        SVar6.Length = 0;
      }
      else {
        pvVar3 = memchr(pcVar4,0x27,__n);
        lStack_50 = (long)pvVar3 - (long)pcVar4;
        if (lStack_50 != -1 && pvVar3 != (void *)0x0) {
          (Storage->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = 0;
          SmallVectorImpl<char>::reserve(Storage,__n);
LAB_0018c013:
          I = (iterator)
              ((ulong)(Storage->super_SmallVectorTemplateBase<char,_true>).
                      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size +
              (long)(Storage->super_SmallVectorTemplateBase<char,_true>).
                    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
          if (lStack_50 != -1) {
            SmallVectorImpl<char>::insert<char_const*,void>(Storage,I,pcVar4,pcVar4 + lStack_50);
            UnquotedValue.Data._0_1_ = 0x27;
            SmallVectorTemplateBase<char,_true>::push_back
                      (&Storage->super_SmallVectorTemplateBase<char,_true>,(char *)&UnquotedValue);
            uVar5 = lStack_50 + 2U;
            if (__n < lStack_50 + 2U) {
              uVar5 = __n;
            }
            pcVar4 = pcVar4 + uVar5;
            __n = __n - uVar5;
            if (__n != 0) goto code_r0x0018c051;
            goto LAB_0018c069;
          }
          SmallVectorImpl<char>::insert<char_const*,void>(Storage,I,pcVar4,pcVar4 + __n);
          SVar6.Length._4_4_ = 0;
          SVar6._0_12_ = *(undefined1 (*) [12])
                          &(Storage->super_SmallVectorTemplateBase<char,_true>).
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase;
        }
      }
    }
    else {
      SVar6 = StringRef::rtrim(this_00,' ');
    }
  }
  return SVar6;
code_r0x0018c051:
  pvVar3 = memchr(pcVar4,0x27,__n);
  lStack_50 = (long)pvVar3 - (long)pcVar4;
  if (pvVar3 == (void *)0x0) {
LAB_0018c069:
    lStack_50 = -1;
  }
  goto LAB_0018c013;
}

Assistant:

StringRef ScalarNode::getValue(SmallVectorImpl<char> &Storage) const {
  // TODO: Handle newlines properly. We need to remove leading whitespace.
  if (Value[0] == '"') { // Double quoted.
    // Pull off the leading and trailing "s.
    StringRef UnquotedValue = Value.substr(1, Value.size() - 2);
    // Search for characters that would require unescaping the value.
    StringRef::size_type i = UnquotedValue.find_first_of("\\\r\n");
    if (i != StringRef::npos)
      return unescapeDoubleQuoted(UnquotedValue, i, Storage);
    return UnquotedValue;
  } else if (Value[0] == '\'') { // Single quoted.
    // Pull off the leading and trailing 's.
    StringRef UnquotedValue = Value.substr(1, Value.size() - 2);
    StringRef::size_type i = UnquotedValue.find('\'');
    if (i != StringRef::npos) {
      // We're going to need Storage.
      Storage.clear();
      Storage.reserve(UnquotedValue.size());
      for (; i != StringRef::npos; i = UnquotedValue.find('\'')) {
        StringRef Valid(UnquotedValue.begin(), i);
        Storage.insert(Storage.end(), Valid.begin(), Valid.end());
        Storage.push_back('\'');
        UnquotedValue = UnquotedValue.substr(i + 2);
      }
      Storage.insert(Storage.end(), UnquotedValue.begin(), UnquotedValue.end());
      return StringRef(Storage.begin(), Storage.size());
    }
    return UnquotedValue;
  }
  // Plain or block.
  return Value.rtrim(' ');
}